

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

void save_cdef_boundary_lines
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int plane,int row,int stripe,int use_highbd
               ,int is_above,RestorationStripeBoundaries *boundaries)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  uint8_t *puVar8;
  size_t __n;
  uint16_t *buf16;
  ushort *__dest;
  undefined1 auVar9 [16];
  
  bVar3 = (byte)use_highbd;
  puVar8 = (uint8_t *)((long)frame->store_buf_adr[(long)plane + -4] * 2);
  if (use_highbd == 0) {
    puVar8 = frame->store_buf_adr[(long)plane + -4];
  }
  iVar1 = *(int *)((long)frame->store_buf_adr + (ulong)(0 < plane) * 4 + -0x28);
  iVar7 = boundaries->stripe_boundary_stride << (bVar3 & 0x1f);
  __dest = (ushort *)
           ((&boundaries->stripe_boundary_above)[is_above == 0] +
           (long)(stripe * iVar7 * 2) + (long)(4 << (bVar3 & 0x1f)));
  if (plane < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)(cm->seq_params->subsampling_x != 0);
  }
  iVar2 = (int)(cm->superres_upscaled_width + uVar5) >> (sbyte)uVar5;
  if (cm->width == cm->superres_upscaled_width) {
    iVar2 = *(int *)((long)frame->store_buf_adr + (ulong)(0 < plane) * 4 + -0x38);
  }
  __n = (size_t)(iVar2 << (bVar3 & 0x1f));
  memcpy(__dest,puVar8 + (long)(iVar1 << (bVar3 & 0x1f)) * (long)row,__n);
  memcpy((byte *)((long)__dest + (long)iVar7),puVar8 + (long)(iVar1 << (bVar3 & 0x1f)) * (long)row,
         __n);
  bVar4 = true;
  do {
    bVar6 = bVar4;
    if (use_highbd == 0) {
      *(uint *)(__dest + -2) = (uint)(byte)*__dest * 0x1010101;
      *(uint *)((long)__dest + (long)iVar2) =
           (uint)*(byte *)((long)__dest + (long)(iVar2 + -1)) * 0x1010101;
    }
    else {
      auVar9 = pshuflw(ZEXT216(*__dest),ZEXT216(*__dest),0);
      *(long *)(__dest + -4) = auVar9._0_8_;
      auVar9 = pshuflw(ZEXT216(__dest[iVar2 + -1]),ZEXT216(__dest[iVar2 + -1]),0);
      *(long *)(__dest + iVar2) = auVar9._0_8_;
    }
    __dest = (ushort *)((long)__dest + (long)iVar7);
    bVar4 = false;
  } while (bVar6);
  return;
}

Assistant:

static void save_cdef_boundary_lines(const YV12_BUFFER_CONFIG *frame,
                                     const AV1_COMMON *cm, int plane, int row,
                                     int stripe, int use_highbd, int is_above,
                                     RestorationStripeBoundaries *boundaries) {
  const int is_uv = plane > 0;
  const uint8_t *src_buf = REAL_PTR(use_highbd, frame->buffers[plane]);
  const int src_stride = frame->strides[is_uv] << use_highbd;
  const uint8_t *src_rows = src_buf + row * (ptrdiff_t)src_stride;

  uint8_t *bdry_buf = is_above ? boundaries->stripe_boundary_above
                               : boundaries->stripe_boundary_below;
  uint8_t *bdry_start = bdry_buf + (RESTORATION_EXTRA_HORZ << use_highbd);
  const int bdry_stride = boundaries->stripe_boundary_stride << use_highbd;
  uint8_t *bdry_rows = bdry_start + RESTORATION_CTX_VERT * stripe * bdry_stride;
  const int src_width = frame->crop_widths[is_uv];

  // At the point where this function is called, we've already applied
  // superres. So we don't need to extend the lines here, we can just
  // pull directly from the topmost row of the upscaled frame.
  const int ss_x = is_uv && cm->seq_params->subsampling_x;
  const int upscaled_width = av1_superres_scaled(cm)
                                 ? (cm->superres_upscaled_width + ss_x) >> ss_x
                                 : src_width;
  const int line_bytes = upscaled_width << use_highbd;
  for (int i = 0; i < RESTORATION_CTX_VERT; i++) {
    // Copy the line at 'src_rows' into both context lines
    memcpy(bdry_rows + i * bdry_stride, src_rows, line_bytes);
  }
  extend_lines(bdry_rows, upscaled_width, RESTORATION_CTX_VERT, bdry_stride,
               RESTORATION_EXTRA_HORZ, use_highbd);
}